

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_item.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::get_item::get_item
          (get_item *this,node *dht_node,node_id *target,data_callback *dcallback,
          nodes_callback *ncallback)

{
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = ncallback->_M_invoker;
  p_Var1 = (ncallback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(ncallback->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(ncallback->super__Function_base)._M_functor + 8);
    (ncallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    ncallback->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  find_data::find_data(&this->super_find_data,dht_node,target,(nodes_callback *)&local_38);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  (this->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm =
       (_func_int **)&PTR__get_item_004d2410;
  ::std::function<void_(const_libtorrent::dht::item_&,_bool)>::function
            (&this->m_data_callback,dcallback);
  item::item(&this->m_data);
  this->m_immutable = true;
  return;
}

Assistant:

get_item::get_item(
	node& dht_node
	, node_id const& target
	, data_callback dcallback
	, nodes_callback ncallback)
	: find_data(dht_node, target, std::move(ncallback))
	, m_data_callback(std::move(dcallback))
	, m_immutable(true)
{
}